

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::ParseAuthorityKeyIdentifierTest_KeyIdentifierAndIssuerAndSerial_Test::
~ParseAuthorityKeyIdentifierTest_KeyIdentifierAndIssuerAndSerial_Test
          (ParseAuthorityKeyIdentifierTest_KeyIdentifierAndIssuerAndSerial_Test *this)

{
  ParseAuthorityKeyIdentifierTest_KeyIdentifierAndIssuerAndSerial_Test *this_local;
  
  ~ParseAuthorityKeyIdentifierTest_KeyIdentifierAndIssuerAndSerial_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParseAuthorityKeyIdentifierTest, KeyIdentifierAndIssuerAndSerial) {
  std::string backing_bytes;
  ParsedAuthorityKeyIdentifier authority_key_identifier;
  ASSERT_TRUE(ParseAuthorityKeyIdentifierTestData(
      "key_identifier_and_issuer_and_serial.pem", &backing_bytes,
      &authority_key_identifier));

  ASSERT_TRUE(authority_key_identifier.key_identifier);
  const uint8_t kExpectedValue[] = {0xDE, 0xAD, 0xB0, 0x0F};
  EXPECT_EQ(der::Input(kExpectedValue),
            authority_key_identifier.key_identifier);

  ASSERT_TRUE(authority_key_identifier.authority_cert_issuer);
  const uint8_t kExpectedIssuer[] = {0xa4, 0x11, 0x30, 0x0f, 0x31, 0x0d, 0x30,
                                     0x0b, 0x06, 0x03, 0x55, 0x04, 0x03, 0x0c,
                                     0x04, 0x52, 0x6f, 0x6f, 0x74};
  EXPECT_EQ(der::Input(kExpectedIssuer),
            authority_key_identifier.authority_cert_issuer);

  ASSERT_TRUE(authority_key_identifier.authority_cert_serial_number);
  const uint8_t kExpectedSerial[] = {0x27, 0x4F};
  EXPECT_EQ(der::Input(kExpectedSerial),
            authority_key_identifier.authority_cert_serial_number);
}